

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

void __thiscall
glslang::TParseContextBase::rValueErrorCheck
          (TParseContextBase *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  TIntermBinary *node_00;
  TIntermTyped *pTVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  TOperator TVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar6;
  undefined4 extraout_var_02;
  char *pcVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TString *name;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar8;
  undefined4 extraout_var_08;
  function<bool_(const_TIntermNode_&)> local_60;
  TIntermTyped *local_40;
  TIntermTyped *leftMostTypeNode;
  TIntermSymbol *symNode;
  TIntermBinary *binaryNode;
  TIntermTyped *node_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseContextBase *this_local;
  
  if (node == (TIntermTyped *)0x0) {
    return;
  }
  binaryNode = (TIntermBinary *)node;
  node_local = (TIntermTyped *)op;
  op_local = (char *)loc;
  loc_local = (TSourceLoc *)this;
  iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[8])();
  symNode = (TIntermSymbol *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0xc])();
  leftMostTypeNode = (TIntermTyped *)CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*(binaryNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x21])();
  bVar3 = TQualifier::isWriteOnly((TQualifier *)CONCAT44(extraout_var_01,iVar4));
  node_00 = binaryNode;
  if (!bVar3) {
    if (symNode == (TIntermSymbol *)0x0) {
      return;
    }
    TVar5 = TIntermOperator::getOp((TIntermOperator *)symNode);
    pcVar2 = op_local;
    pTVar1 = node_local;
    if ((3 < TVar5 - EOpIndexDirect) && (TVar5 != EOpMatrixSwizzle)) {
      return;
    }
    iVar4 = (*(symNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x43])
              (this,pcVar2,pTVar1,CONCAT44(extraout_var_08,iVar4));
    return;
  }
  std::function<bool_(const_TIntermNode_&)>::function(&local_60);
  pTVar6 = TIntermediate::traverseLValueBase((TIntermTyped *)node_00,true,false,&local_60);
  std::function<bool_(const_TIntermNode_&)>::~function(&local_60);
  pcVar2 = op_local;
  pTVar1 = node_local;
  local_40 = pTVar6;
  if (leftMostTypeNode != (TIntermTyped *)0x0) {
    iVar4 = (*(leftMostTypeNode->super_TIntermNode)._vptr_TIntermNode[0x32])();
    pcVar7 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_02,iVar4));
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
              (this,pcVar2,"can\'t read from writeonly object: ",pTVar1,pcVar7);
    return;
  }
  if (symNode == (TIntermSymbol *)0x0) {
LAB_00747f2c:
    (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
              (this,op_local,"can\'t read from writeonly object: ",node_local,"");
  }
  else {
    iVar4 = (*(symNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
    TVar5 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_03,iVar4));
    if (TVar5 != EOpIndexDirectStruct) {
      iVar4 = (*(symNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
      TVar5 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_04,iVar4));
      if (TVar5 != EOpIndexDirect) goto LAB_00747f2c;
    }
    iVar4 = (*(local_40->super_TIntermNode)._vptr_TIntermNode[0x18])();
    name = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 400))();
    bVar3 = IsAnonymous(name);
    pcVar2 = op_local;
    pTVar1 = node_local;
    if (bVar3) {
      iVar4 = (*(local_40->super_TIntermNode)._vptr_TIntermNode[0x18])();
      pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar4) + 0x1a0))();
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pbVar8);
      (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                (this,pcVar2,"can\'t read from writeonly object: ",pTVar1,pcVar7);
    }
    else {
      iVar4 = (*(local_40->super_TIntermNode)._vptr_TIntermNode[0x18])();
      pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 400))();
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (pbVar8);
      (*(this->super_TParseVersions)._vptr_TParseVersions[0x2d])
                (this,pcVar2,"can\'t read from writeonly object: ",pTVar1,pcVar7);
    }
  }
  return;
}

Assistant:

void TParseContextBase::rValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    if (! node)
        return;

    TIntermBinary* binaryNode = node->getAsBinaryNode();
    const TIntermSymbol* symNode = node->getAsSymbolNode();

    if (node->getQualifier().isWriteOnly()) {
        const TIntermTyped* leftMostTypeNode = TIntermediate::traverseLValueBase(node, true);

        if (symNode != nullptr)
            error(loc, "can't read from writeonly object: ", op, symNode->getName().c_str());
        else if (binaryNode &&
                (binaryNode->getAsOperator()->getOp() == EOpIndexDirectStruct ||
                 binaryNode->getAsOperator()->getOp() == EOpIndexDirect))
            if(IsAnonymous(leftMostTypeNode->getAsSymbolNode()->getName()))
                error(loc, "can't read from writeonly object: ", op, leftMostTypeNode->getAsSymbolNode()->getAccessName().c_str());
            else
                error(loc, "can't read from writeonly object: ", op, leftMostTypeNode->getAsSymbolNode()->getName().c_str());
        else
            error(loc, "can't read from writeonly object: ", op, "");

    } else {
        if (binaryNode) {
            switch (binaryNode->getOp()) {
            case EOpIndexDirect:
            case EOpIndexIndirect:
            case EOpIndexDirectStruct:
            case EOpVectorSwizzle:
            case EOpMatrixSwizzle:
                rValueErrorCheck(loc, op, binaryNode->getLeft());
                break;
            default:
                break;
            }
        }
    }
}